

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_BrepTrimArray::Read(ON_BrepTrimArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  ON_BrepTrim *pOVar3;
  bool local_51;
  ON_BrepTrim *trim;
  int local_38;
  int iStack_34;
  bool rc;
  int minor_version;
  int major_version;
  int i;
  int count;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  ON_BinaryArchive *pOStack_18;
  ON__UINT32 tcode;
  ON_BinaryArchive *file_local;
  ON_BrepTrimArray *this_local;
  
  pOStack_18 = file;
  file_local = (ON_BinaryArchive *)this;
  ON_ClassArray<ON_BrepTrim>::Empty((ON_ClassArray<ON_BrepTrim> *)this);
  length_TCODE_ANONYMOUS_CHUNK._4_4_ = 0;
  _i = 0;
  major_version = 0;
  iStack_34 = 0;
  local_38 = 0;
  trim._7_1_ = ON_BinaryArchive::BeginRead3dmBigChunk
                         (pOStack_18,(uint *)((long)&length_TCODE_ANONYMOUS_CHUNK + 4),
                          (ON__INT64 *)&i);
  if (trim._7_1_) {
    if (length_TCODE_ANONYMOUS_CHUNK._4_4_ != 0x40008000) {
      trim._7_1_ = false;
    }
    if (trim._7_1_ != false) {
      trim._7_1_ = ON_BinaryArchive::Read3dmChunkVersion
                             (pOStack_18,&stack0xffffffffffffffcc,&local_38);
    }
    if (trim._7_1_ != false) {
      if (iStack_34 == 1) {
        if (trim._7_1_ != false) {
          trim._7_1_ = ON_BinaryArchive::ReadInt(pOStack_18,&major_version);
        }
        ON_ClassArray<ON_BrepTrim>::SetCapacity
                  ((ON_ClassArray<ON_BrepTrim> *)this,(long)major_version);
        minor_version = 0;
        while( true ) {
          local_51 = false;
          if (minor_version < major_version) {
            local_51 = trim._7_1_;
          }
          if (local_51 == false) break;
          pOVar3 = ON_ClassArray<ON_BrepTrim>::AppendNew((ON_ClassArray<ON_BrepTrim> *)this);
          iVar2 = (*(pOVar3->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                    _vptr_ON_Object[0xb])(pOVar3,pOStack_18);
          trim._7_1_ = (bool)(-(char)iVar2 & 1);
          if ((trim._7_1_ != false) &&
             (pOVar3->m_trim_index !=
              (this->super_ON_ObjectArray<ON_BrepTrim>).super_ON_ClassArray<ON_BrepTrim>.m_count +
              -1)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_io.cpp"
                       ,0x1e3,"","Invalid value of m_trim_index");
            pOVar3->m_trim_index =
                 (this->super_ON_ObjectArray<ON_BrepTrim>).super_ON_ClassArray<ON_BrepTrim>.m_count
                 + -1;
          }
          minor_version = minor_version + 1;
        }
      }
      else {
        trim._7_1_ = false;
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_18);
    if (!bVar1) {
      trim._7_1_ = false;
    }
  }
  return trim._7_1_;
}

Assistant:

bool ON_BrepTrimArray::Read( ON_BinaryArchive& file )
{
  Empty();
  ON__UINT32 tcode = 0;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
  int count = 0;
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
  if (rc) {
    if (tcode != TCODE_ANONYMOUS_CHUNK)
      rc = false;
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc) {
      if ( major_version==1 ) {
        if (rc) rc = file.ReadInt(&count);
        SetCapacity(count);
        for ( i = 0; i < count && rc ; i++ ) {
          ON_BrepTrim& trim = AppendNew();
          rc = trim.Read(file)?true:false;
          if ( rc )
          {
            if ( trim.m_trim_index != m_count-1 )
            {
              // 28 May 2013 Dale Lear
              //   Fix http://mcneel.myjetbrains.com/youtrack/issue/RH-18299
              //   Fix bogus index values to prevent crashes.
              ON_ERROR("Invalid value of m_trim_index");
              trim.m_trim_index = m_count-1;
            }
          }
        }    
      }
      else {
        rc = 0;
      }
    }
    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}